

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchive.hpp
# Opt level: O0

ZipEntry __thiscall Zippy::ZipArchive::GetEntry(ZipArchive *this,string *name)

{
  bool bVar1;
  allocator<char> *__a;
  mz_zip_archive *pZip;
  pointer pZVar2;
  uchar *puVar3;
  string *err;
  ZipRuntimeError *this_00;
  reference entry;
  ZipEntry *extraout_RDX;
  ZipArchive *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ZipEntry ZVar4;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  result;
  string *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  mz_uint flags;
  size_t in_stack_ffffffffffffff18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff20;
  ZipEntryData *pBuf;
  anon_class_8_1_898f2789_for__M_pred in_stack_ffffffffffffff28;
  mz_zip_archive *pFilename;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  in_stack_ffffffffffffff30;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  in_stack_ffffffffffffff38;
  allocator<char> *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  local_58;
  undefined1 local_4d;
  char local_39 [57];
  
  this_01 = in_RDI;
  bVar1 = IsOpen(in_RSI);
  if (!bVar1) {
    local_4d = 1;
    __a = (allocator<char> *)__cxa_allocate_exception(0x10);
    __s = local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,__s,__a);
    ZipLogicError::ZipLogicError
              ((ZipLogicError *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    local_4d = 0;
    __cxa_throw(__a,&ZipLogicError::typeinfo,ZipLogicError::~ZipLogicError);
  }
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::begin
            ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
             in_stack_ffffffffffffff08);
  std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>::end
            ((vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_> *)
             in_stack_ffffffffffffff08);
  local_58 = std::
             find_if<__gnu_cxx::__normal_iterator<Zippy::Impl::ZipEntry*,std::vector<Zippy::Impl::ZipEntry,std::allocator<Zippy::Impl::ZipEntry>>>,Zippy::ZipArchive::GetEntry(std::__cxx11::string_const&)::_lambda(Zippy::Impl::ZipEntry_const&)_1_>
                       (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                        in_stack_ffffffffffffff28);
  __gnu_cxx::
  __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
  ::operator->(&local_58);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffff20);
  if (bVar1) {
    pZVar2 = __gnu_cxx::
             __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
             ::operator->(&local_58);
    pBuf = &pZVar2->m_EntryData;
    pZVar2 = __gnu_cxx::
             __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
             ::operator->(&local_58);
    Impl::ZipEntry::UncompressedSize(pZVar2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_ffffffffffffff30._M_current,(size_type)in_stack_ffffffffffffff28.name);
    pFilename = &in_RSI->m_Archive;
    pZip = (mz_zip_archive *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_stack_ffffffffffffff10);
    flags = (mz_uint)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    __gnu_cxx::
    __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
    ::operator->(&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12fe24);
    pZVar2 = __gnu_cxx::
             __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
             ::operator->(&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pZVar2->m_EntryData);
    mz_zip_reader_extract_file_to_mem(pZip,(char *)pFilename,pBuf,in_stack_ffffffffffffff18,flags);
  }
  pZVar2 = __gnu_cxx::
           __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
           ::operator->(&local_58);
  bVar1 = Impl::ZipEntry::IsDirectory(pZVar2);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
    ::operator->(&local_58);
    puVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12fe98);
    if (puVar3 == (uchar *)0x0) {
      err = (string *)__cxa_allocate_exception(0x10);
      this_00 = (ZipRuntimeError *)mz_zip_get_error_string((in_RSI->m_Archive).m_last_error);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      ZipRuntimeError::ZipRuntimeError(this_00,err);
      __cxa_throw(err,&ZipRuntimeError::typeinfo,ZipRuntimeError::~ZipRuntimeError);
    }
  }
  entry = __gnu_cxx::
          __normal_iterator<Zippy::Impl::ZipEntry_*,_std::vector<Zippy::Impl::ZipEntry,_std::allocator<Zippy::Impl::ZipEntry>_>_>
          ::operator*(&local_58);
  ZipEntry::ZipEntry((ZipEntry *)this_01,entry);
  ZVar4.m_ZipEntry = extraout_RDX;
  ZVar4._vptr_ZipEntry = (_func_int **)in_RDI;
  return ZVar4;
}

Assistant:

ZipEntry GetEntry(const std::string& name) {

            if (!IsOpen()) throw ZipLogicError("Cannot call GetEntry on empty ZipArchive object!");

            // ===== Look up ZipEntry object.
            auto result = std::find_if(m_ZipEntries.begin(), m_ZipEntries.end(), [&](const Impl::ZipEntry& entry) {
                return name == entry.GetName();
            });

            // ===== If data has not been extracted from the archive (i.e., m_EntryData is empty),
            // ===== extract the data from the archive to the ZipEntry object.
            if (result->m_EntryData.empty()) {
                result->m_EntryData.resize(result->UncompressedSize());
                mz_zip_reader_extract_file_to_mem(&m_Archive, name.c_str(), result->m_EntryData.data(),
                                                  result->m_EntryData.size(), 0);
            }

            // ===== Check that the operation was successful
            if (!result->IsDirectory() && result->m_EntryData.data() == nullptr)
                throw ZipRuntimeError(mz_zip_get_error_string(m_Archive.m_last_error));

            // ===== Return ZipEntry object with the file data.
            return ZipEntry(&*result);
        }